

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O1

void __thiscall KktCheck::chStOfLagrangian(KktCheck *this)

{
  pointer piVar1;
  pointer piVar2;
  pointer pdVar3;
  pointer pdVar4;
  bool bVar5;
  ostream *poVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  double dVar10;
  
  this->j = 0;
  if (0 < this->numCol) {
    iVar9 = 0;
    bVar5 = true;
    do {
      lVar7 = (long)iVar9;
      piVar1 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar10 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar7] -
               (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar7];
      iVar9 = piVar1[lVar7];
      lVar8 = (long)iVar9;
      this->k = iVar9;
      if (iVar9 < piVar1[lVar7 + 1]) {
        piVar2 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar3 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar4 = (this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          iVar9 = iVar9 + 1;
          dVar10 = dVar10 + pdVar4[piVar2[lVar8]] * pdVar3[lVar8];
          lVar8 = lVar8 + 1;
          this->k = iVar9;
        } while (lVar8 < piVar1[lVar7 + 1]);
      }
      if (this->tol <= ABS(dVar10) && ABS(dVar10) != this->tol) {
        if (this->print == 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Column ",7);
          poVar6 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)&std::cout,
                              (this->cIndexRev).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start[this->j]);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6," fails stationary of Lagrangian: dL/dx",0x26);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->j);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
          poVar6 = std::ostream::_M_insert<double>(dVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,", rather than zero.",0x13);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
        }
        bVar5 = false;
      }
      iVar9 = this->j + 1;
      this->j = iVar9;
    } while (iVar9 < this->numCol);
    if (!bVar5) {
      if (this->print == 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"KKT check error: Lagrangian is not stationary.\n",0x2f);
      }
      this->istrueGlb = true;
      return;
    }
  }
  if (this->print != 1) {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Stationarity of Lagrangian.\n",0x1c);
  return;
}

Assistant:

void KktCheck::chStOfLagrangian() {
	bool istrue = true;
	double lagrV;
	//A'y + c - z = 0
	for (j=0; j<numCol;j++) {
		lagrV = colCost[j] -colDual[j];
		for (k=Astart[j]; k<Astart[j+1]; k++) 
				lagrV = lagrV + rowDual[Aindex[k]]*Avalue[k];
				
		if (abs(lagrV) > tol) {
			if (print == 1) 
				cout<<"Column "<<cIndexRev[j]<<" fails stationary of Lagrangian: dL/dx"<<j<<" = "<<lagrV<<", rather than zero."<<endl;
				//cout<<"Column "<<j<<" fails stationary of Lagrangian: dL/dx"<<j<<" = "<<lagrV<<", rather than zero."<<endl;
			istrue = false;
		}
	}
	
	if (istrue) {
		if (print == 1) 
			cout<<"Stationarity of Lagrangian.\n";
	}
	else {
		if (print == 1) 
			cout<<"KKT check error: Lagrangian is not stationary.\n";
		istrueGlb = true;
	}

}